

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shell_utils.c
# Opt level: O0

char * apprun_shell_expand_variables(char *str,char **argv)

{
  uint uVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  size_t sVar5;
  uint section_len_1;
  char *var_value;
  char *var_name;
  uint section_len;
  char *var_end;
  char *var_start;
  char *itr;
  char *buffer;
  uint buffer_len;
  uint buffer_capacity;
  char **argv_local;
  char *str_local;
  
  if (str == (char *)0x0) {
    str_local = (char *)0x0;
  }
  else {
    buffer._4_4_ = 1;
    buffer._0_4_ = 0;
    itr = (char *)calloc(1,8);
    var_start = str;
    while (*var_start != '\0') {
      pcVar3 = apprun_shell_find_var_start(var_start);
      pcVar4 = apprun_shell_find_var_end(pcVar3);
      if (var_start < pcVar3) {
        uVar1 = (int)pcVar3 - (int)var_start;
        if (buffer._4_4_ < (int)buffer + uVar1) {
          buffer._4_4_ = buffer._4_4_ + uVar1;
          itr = apprun_string_extend(itr,buffer._4_4_);
        }
        strncat(itr,var_start,(ulong)uVar1);
        buffer._0_4_ = uVar1 + (int)buffer;
      }
      var_start = pcVar4;
      if (pcVar3 != pcVar4) {
        pcVar3 = apprun_shell_extract_var_name(pcVar3);
        pcVar4 = apprun_shell_resolve_var_value(argv,pcVar3);
        free(pcVar3);
        if (pcVar4 != (char *)0x0) {
          sVar5 = strlen(pcVar4);
          iVar2 = (int)sVar5;
          if (buffer._4_4_ < (uint)((int)buffer + iVar2)) {
            buffer._4_4_ = buffer._4_4_ + iVar2;
            itr = apprun_string_extend(itr,buffer._4_4_);
          }
          strcat(itr,pcVar4);
          buffer._0_4_ = iVar2 + (int)buffer;
          free(pcVar4);
        }
      }
    }
    str_local = itr;
  }
  return str_local;
}

Assistant:

char *apprun_shell_expand_variables(char const *str, char **argv) {
    if (str == NULL)
        return NULL;

    unsigned buffer_capacity = 1;
    unsigned buffer_len = 0;
    char *buffer = calloc(buffer_capacity, sizeof(char *));

    char const *itr = str;

    while (*itr != '\0') {
        char const *var_start = apprun_shell_find_var_start(itr);
        char const *var_end = apprun_shell_find_var_end(var_start);


        if (var_start > itr) {
            unsigned section_len = var_start - itr;
            if (buffer_len + section_len > buffer_capacity) {
                buffer_capacity = buffer_capacity + section_len;
                buffer = apprun_string_extend(buffer, buffer_capacity);
            }

            strncat(buffer, itr, section_len);
            buffer_len += section_len;
        }


        if (var_start != var_end) {
            char *var_name = apprun_shell_extract_var_name(var_start);
            char *var_value = apprun_shell_resolve_var_value(argv, var_name);

            free(var_name);

            if (var_value) {
                unsigned section_len = strlen(var_value);
                if (buffer_len + section_len > buffer_capacity) {
                    buffer_capacity = buffer_capacity + section_len;
                    buffer = apprun_string_extend(buffer, buffer_capacity);
                }

                strcat(buffer, var_value);
                buffer_len += section_len;
                free(var_value);
            }
        }

        itr = var_end;
    }


    return buffer;
}